

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O2

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled_Test
           *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper AStack_58;
  AssertionResult gtest_ar_;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      gtest_ar._0_8_ = &(this->super_ContractTestOnClassWithInvariant).sut;
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)anon_var_dwarf_3232;
      (this->super_ContractTestOnClassWithInvariant).sut.x = 6;
      uVar1 = (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled;
      uVar2 = (this->super_ContractTestOnClassWithInvariant).sut._contract_light_contractor;
      (this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled = uVar1 + 1;
      (this->super_ContractTestOnClassWithInvariant).sut._contract_light_contractor =
           (Contract)(uVar2 + 1);
      contract_light::v_100::contract_detail::handleFailedPostCondition
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
                 ,0x2c);
      contract_light::v_100::contract_detail::InvariantPolicy::
      checkInvariant<contract_light::v_100::contract_detail::PostConditionContext<(anonymous_namespace)::TestClassWithInvariant>const>
                ((PostConditionContext<(anonymous_namespace)::TestClassWithInvariant> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8a,"Expected: sut.doubleX(2) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  gtest_ar_.success_ = (bool)(anonymous_namespace)::postConditionHasFailedFlag;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if ((bool)(anonymous_namespace)::postConditionHasFailedFlag == false) {
    testing::Message::Message((Message *)&AStack_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"postConditionHasFailedFlag","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8b,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&AStack_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sut.invariantWasCalled",(int *)&gtest_ar_,
             &(this->super_ContractTestOnClassWithInvariant).sut.invariantWasCalled);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sut.postConditionWasCalled",(int *)&gtest_ar_,
             &(this->super_ContractTestOnClassWithInvariant).sut.postConditionWasCalled);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/FelixPetriconi[P]contract_light/test/contract_light_test.cpp"
               ,0x8e,pcVar4);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled)
{
  EXPECT_NO_THROW(sut.doubleX(2));
  EXPECT_TRUE(postConditionHasFailedFlag);

  EXPECT_EQ(1, sut.invariantWasCalled);
  EXPECT_EQ(1, sut.postConditionWasCalled);
}